

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

float notch::core::internal::dot<float*,float*>
                (size_t n,float *x_begin,size_t x_stride,float *y_begin,size_t y_stride)

{
  ulong local_50;
  size_t i;
  float *y;
  float *x;
  double dotProduct;
  size_t y_stride_local;
  float *y_begin_local;
  size_t x_stride_local;
  float *x_begin_local;
  size_t n_local;
  
  x = (float *)0x0;
  i = (size_t)y_begin;
  y = x_begin;
  for (local_50 = 0; local_50 < n; local_50 = local_50 + 1) {
    x = (float *)((double)(*y * *(float *)i) + (double)x);
    y = y + x_stride;
    i = y_stride * 4 + i;
  }
  return (float)(double)x;
}

Assistant:

float
INTERNAL_NOBLAS(dot)(
    const size_t n,
    VectorX_Iter x_begin, const size_t x_stride,
    VectorY_Iter y_begin, const size_t y_stride) {
    double dotProduct = 0.0;
    auto x = x_begin;
    auto y = y_begin;
    for (size_t i = 0; i < n; ++i) {
        dotProduct += (*x) * (*y);
        x += x_stride;
        y += y_stride;
    }
    return static_cast<float>(dotProduct);
}